

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void diy::Serialization<diy::AMRLink::Description>::save(BinaryBuffer *bb,Description *x)

{
  BinaryBuffer *in_RSI;
  Bounds<int> *in_stack_ffffffffffffffe8;
  
  save<int>(in_RSI,(int *)in_stack_ffffffffffffffe8);
  save<diy::DynamicPoint<int,4ul>>(in_RSI,&in_stack_ffffffffffffffe8->min);
  save<diy::Bounds<int>>(in_RSI,in_stack_ffffffffffffffe8);
  save<diy::Bounds<int>>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void         save(diy::BinaryBuffer& bb, const diy::AMRLink::Description& x)
        {
            diy::save(bb, x.level);
            diy::save(bb, x.refinement);
            diy::save(bb, x.core);
            diy::save(bb, x.bounds);
        }